

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O0

int64_t aom_sse_avx2(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int width,int height)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  int iVar6;
  int in_ECX;
  void *in_RDX;
  int in_ESI;
  void *in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint8_t *b2;
  uint8_t *a2;
  int i_1;
  int i;
  __m256i temp;
  __m256i v_bsub;
  __m256i v_asub;
  __m256i v_bu;
  __m256i v_bl;
  __m256i v_au;
  __m256i v_al;
  __m256i v_b;
  __m256i v_a;
  __m128i v_b1;
  __m128i v_b0;
  __m128i v_a1;
  __m128i v_a0;
  __m256i zero;
  __m256i sum;
  int64_t sse;
  int32_t y;
  undefined4 local_508;
  undefined4 local_504;
  __m256i *sum_all;
  undefined1 in_stack_fffffffffffffb80 [32];
  int b_stride_00;
  uint8_t *b_00;
  int a_stride_00;
  uint8_t *a_00;
  undefined1 in_stack_fffffffffffffba0 [32];
  __m256i *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  uint8_t *in_stack_fffffffffffffc00;
  uint8_t *in_stack_fffffffffffffc08;
  __m256i *in_stack_fffffffffffffc10;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined1 local_380 [32];
  undefined8 local_350;
  undefined4 local_348;
  undefined8 local_338;
  undefined8 local_328;
  
  local_348 = 0;
  local_380 = ZEXT1632(ZEXT816(0));
  auVar3 = ZEXT1632(ZEXT816(0));
  sum_all = in_stack_fffffffffffffb80._16_8_;
  if (in_R8D == 4) {
    do {
      sse_w4x4_avx2((uint8_t *)in_stack_fffffffffffffc10,
                    (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                    (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),in_stack_fffffffffffffbf0);
      local_348 = local_348 + 4;
    } while (local_348 < in_R9D);
    local_350 = summary_all_avx2(sum_all);
  }
  else {
    b_stride_00 = in_stack_fffffffffffffb80._28_4_;
    a_stride_00 = in_stack_fffffffffffffba0._12_4_;
    b_00 = in_stack_fffffffffffffba0._0_8_;
    a_00 = in_stack_fffffffffffffba0._16_8_;
    if (in_R8D == 8) {
      do {
        sse_w8x2_avx2(a_00,a_stride_00,b_00,b_stride_00,sum_all);
        local_348 = local_348 + 2;
      } while (local_348 < in_R9D);
      local_350 = summary_all_avx2(sum_all);
    }
    else {
      local_338 = in_RDX;
      local_328 = in_RDI;
      if (in_R8D == 0x10) {
        do {
          auVar7 = auVar3._0_16_;
          xx_loadu_128(local_328);
          auVar8 = auVar7;
          xx_loadu_128((void *)((long)local_328 + (long)in_ESI));
          auVar9 = auVar8;
          xx_loadu_128(local_338);
          auVar10 = auVar9;
          xx_loadu_128((void *)((long)local_338 + (long)in_ECX));
          local_3c0 = auVar8._0_8_;
          uStack_3b8 = auVar8._8_8_;
          local_3e0 = auVar10._0_8_;
          uStack_3d8 = auVar10._8_8_;
          auVar3._16_8_ = local_3c0;
          auVar3._0_16_ = auVar7;
          auVar3._24_8_ = uStack_3b8;
          auVar3 = vpunpcklbw_avx2(auVar3,ZEXT1632(ZEXT816(0)));
          auVar1._16_8_ = local_3c0;
          auVar1._0_16_ = auVar7;
          auVar1._24_8_ = uStack_3b8;
          auVar1 = vpunpckhbw_avx2(auVar1,ZEXT1632(ZEXT816(0)));
          auVar2._16_8_ = local_3e0;
          auVar2._0_16_ = auVar9;
          auVar2._24_8_ = uStack_3d8;
          auVar4 = vpunpcklbw_avx2(auVar2,ZEXT1632(ZEXT816(0)));
          auVar5._16_8_ = local_3e0;
          auVar5._0_16_ = auVar9;
          auVar5._24_8_ = uStack_3d8;
          auVar2 = vpunpckhbw_avx2(auVar5,ZEXT1632(ZEXT816(0)));
          auVar3 = vpsubw_avx2(auVar3,auVar4);
          auVar1 = vpsubw_avx2(auVar1,auVar2);
          auVar3 = vpmaddwd_avx2(auVar3,auVar3);
          auVar1 = vpmaddwd_avx2(auVar1,auVar1);
          auVar3 = vpaddd_avx2(auVar3,auVar1);
          auVar3 = vpaddd_avx2(local_380,auVar3);
          local_328 = (void *)((long)local_328 + (long)(in_ESI << 1));
          local_338 = (void *)((long)local_338 + (long)(in_ECX << 1));
          local_348 = local_348 + 2;
          local_380 = auVar3;
        } while (local_348 < in_R9D);
        local_350 = summary_all_avx2(auVar4._16_8_);
      }
      else if (in_R8D == 0x20) {
        do {
          sse_w32_avx2(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00
                      );
          local_348 = local_348 + 1;
        } while (local_348 < in_R9D);
        local_350 = summary_all_avx2(sum_all);
      }
      else if (in_R8D == 0x40) {
        do {
          sse_w32_avx2(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00
                      );
          sse_w32_avx2(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00
                      );
          local_348 = local_348 + 1;
        } while (local_348 < in_R9D);
        local_350 = summary_all_avx2(sum_all);
      }
      else if (in_R8D == 0x80) {
        do {
          sse_w32_avx2(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00
                      );
          sse_w32_avx2(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00
                      );
          sse_w32_avx2(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00
                      );
          sse_w32_avx2(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,in_stack_fffffffffffffc00
                      );
          local_348 = local_348 + 1;
        } while (local_348 < in_R9D);
        local_350 = summary_all_avx2(sum_all);
      }
      else {
        if ((in_R8D & 7) == 0) {
          do {
            local_504 = 0;
            do {
              sse_w8x2_avx2(a_00,a_stride_00,b_00,b_stride_00,sum_all);
              local_504 = local_504 + 8;
            } while (local_504 < (int)in_R8D);
            local_348 = local_348 + 2;
          } while (local_348 < in_R9D);
        }
        else {
          do {
            local_508 = 0;
            do {
              sse_w8x2_avx2(a_00,a_stride_00,b_00,b_stride_00,sum_all);
              sse_w8x2_avx2(a_00,a_stride_00,b_00,b_stride_00,sum_all);
              iVar6 = local_508 + 0xc;
              local_508 = local_508 + 8;
            } while (iVar6 < (int)in_R8D);
            sse_w4x4_avx2((uint8_t *)in_stack_fffffffffffffc10,
                          (int)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
                          (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),in_stack_fffffffffffffbf0)
            ;
            local_348 = local_348 + 4;
          } while (local_348 < in_R9D);
        }
        local_350 = summary_all_avx2(sum_all);
      }
    }
  }
  return local_350;
}

Assistant:

int64_t aom_sse_avx2(const uint8_t *a, int a_stride, const uint8_t *b,
                     int b_stride, int width, int height) {
  int32_t y = 0;
  int64_t sse = 0;
  __m256i sum = _mm256_setzero_si256();
  __m256i zero = _mm256_setzero_si256();
  switch (width) {
    case 4:
      do {
        sse_w4x4_avx2(a, a_stride, b, b_stride, &sum);
        a += a_stride << 2;
        b += b_stride << 2;
        y += 4;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 8:
      do {
        sse_w8x2_avx2(a, a_stride, b, b_stride, &sum);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 16:
      do {
        const __m128i v_a0 = xx_loadu_128(a);
        const __m128i v_a1 = xx_loadu_128(a + a_stride);
        const __m128i v_b0 = xx_loadu_128(b);
        const __m128i v_b1 = xx_loadu_128(b + b_stride);
        const __m256i v_a =
            _mm256_insertf128_si256(_mm256_castsi128_si256(v_a0), v_a1, 0x01);
        const __m256i v_b =
            _mm256_insertf128_si256(_mm256_castsi128_si256(v_b0), v_b1, 0x01);
        const __m256i v_al = _mm256_unpacklo_epi8(v_a, zero);
        const __m256i v_au = _mm256_unpackhi_epi8(v_a, zero);
        const __m256i v_bl = _mm256_unpacklo_epi8(v_b, zero);
        const __m256i v_bu = _mm256_unpackhi_epi8(v_b, zero);
        const __m256i v_asub = _mm256_sub_epi16(v_al, v_bl);
        const __m256i v_bsub = _mm256_sub_epi16(v_au, v_bu);
        const __m256i temp =
            _mm256_add_epi32(_mm256_madd_epi16(v_asub, v_asub),
                             _mm256_madd_epi16(v_bsub, v_bsub));
        sum = _mm256_add_epi32(sum, temp);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 32:
      do {
        sse_w32_avx2(&sum, a, b);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 64:
      do {
        sse_w32_avx2(&sum, a, b);
        sse_w32_avx2(&sum, a + 32, b + 32);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    case 128:
      do {
        sse_w32_avx2(&sum, a, b);
        sse_w32_avx2(&sum, a + 32, b + 32);
        sse_w32_avx2(&sum, a + 64, b + 64);
        sse_w32_avx2(&sum, a + 96, b + 96);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_avx2(&sum);
      break;
    default:
      if ((width & 0x07) == 0) {
        do {
          int i = 0;
          do {
            sse_w8x2_avx2(a + i, a_stride, b + i, b_stride, &sum);
            i += 8;
          } while (i < width);
          a += a_stride << 1;
          b += b_stride << 1;
          y += 2;
        } while (y < height);
      } else {
        do {
          int i = 0;
          do {
            sse_w8x2_avx2(a + i, a_stride, b + i, b_stride, &sum);
            const uint8_t *a2 = a + i + (a_stride << 1);
            const uint8_t *b2 = b + i + (b_stride << 1);
            sse_w8x2_avx2(a2, a_stride, b2, b_stride, &sum);
            i += 8;
          } while (i + 4 < width);
          sse_w4x4_avx2(a + i, a_stride, b + i, b_stride, &sum);
          a += a_stride << 2;
          b += b_stride << 2;
          y += 4;
        } while (y < height);
      }
      sse = summary_all_avx2(&sum);
      break;
  }

  return sse;
}